

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

void __thiscall
tlx::CmdlineParser::add_stringlist
          (CmdlineParser *this,string *longkey,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dest,string *desc)

{
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"",&local_49);
  add_stringlist(this,'\0',longkey,&local_48,dest,desc);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void CmdlineParser::add_stringlist(
    const std::string& longkey,
    std::vector<std::string>& dest, const std::string& desc) {
    return add_stringlist(0, longkey, "", dest, desc);
}